

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyReadTimingSense(Scl_Tree_t *p,Scl_Item_t *pPin)

{
  int iVar1;
  char *__s1;
  char *pToken;
  Scl_Item_t *pItem;
  Scl_Item_t *pPin_local;
  Scl_Tree_t *p_local;
  
  pToken = (char *)Scl_LibertyItem(p,pPin->Child);
  while( true ) {
    if (pToken == (char *)0x0) {
      return 3;
    }
    iVar1 = Scl_LibertyCompare(p,*(Scl_Pair_t *)(pToken + 8),"timing_sense");
    if (iVar1 == 0) break;
    pToken = (char *)Scl_LibertyItem(p,*(int *)(pToken + 0x20));
  }
  __s1 = Scl_LibertyReadString(p,*(Scl_Pair_t *)(pToken + 0x10));
  iVar1 = strcmp(__s1,"positive_unate");
  if (iVar1 == 0) {
    return 1;
  }
  iVar1 = strcmp(__s1,"negative_unate");
  if (iVar1 == 0) {
    return 2;
  }
  iVar1 = strcmp(__s1,"non_unate");
  if (iVar1 != 0) {
    return 3;
  }
  return 3;
}

Assistant:

int Scl_LibertyReadTimingSense( Scl_Tree_t * p, Scl_Item_t * pPin )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, pPin, pItem, "timing_sense" )
    {
        char * pToken = Scl_LibertyReadString(p, pItem->Head);
        if ( !strcmp(pToken, "positive_unate") )
            return sc_ts_Pos;
        if ( !strcmp(pToken, "negative_unate") )
            return sc_ts_Neg;
        if ( !strcmp(pToken, "non_unate") )
            return sc_ts_Non;
        break;
    }
    return sc_ts_Non;
}